

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O2

uint32_t lzma_index_checks(lzma_index *i)

{
  index_tree_node *piVar1;
  uint uVar2;
  
  uVar2 = i->checks;
  piVar1 = (i->streams).rightmost;
  if (*(int *)&piVar1[2].left != -1) {
    uVar2 = uVar2 | 1 << ((byte)piVar1[3].uncompressed_base & 0x1f);
  }
  return uVar2;
}

Assistant:

extern LZMA_API(uint32_t)
lzma_index_checks(const lzma_index *i)
{
	uint32_t checks = i->checks;

	// Get the type of the Check of the last Stream too.
	const index_stream *s = (const index_stream *)(i->streams.rightmost);
	if (s->stream_flags.version != UINT32_MAX)
		checks |= UINT32_C(1) << s->stream_flags.check;

	return checks;
}